

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O2

void __thiscall hypermind::CompileUnit::DefineVariable(CompileUnit *this,HMInteger index)

{
  Variable local_10;
  
  if (this->mScopeDepth != -1) {
    return;
  }
  local_10.scopeType = Module;
  local_10.index = index;
  EmitStoreVariable(this,&local_10);
  EmitPop(this);
  return;
}

Assistant:

void DefineVariable(HMInteger index) {
            if (mScopeDepth == -1) {
                // 作用域为模块作用域
                EmitStoreVariable(Variable(ScopeType::Module, index));
                EmitPop();
            } else {
//                EmitStoreVariable(Variable(ScopeType::Local, index));
            }

            // 不是模块作用域 不用管
        }